

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O2

void iterator_suite::test_const_iterator(void)

{
  bool v;
  initializer_list<int> __l;
  const_iterator first_begin;
  allocator_type local_a1;
  const_iterator local_a0;
  vector<int,_std::allocator<int>_> expect;
  const_iterator local_78;
  array<int,_4UL> array;
  circular_view<int,_18446744073709551615UL> span;
  
  span.member.data = array._M_elems;
  array._M_elems[0] = 0;
  array._M_elems[1] = 0;
  array._M_elems[2] = 0;
  array._M_elems[3] = 0;
  span.member.cap = 4;
  span.member.size = 0;
  span.member.next = 4;
  vista::circular_view<int,_18446744073709551615UL>::push_back(&span,0xb);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._0_16_ =
       vista::circular_view<int,_18446744073709551615UL>::cbegin(&span);
  local_78 = vista::circular_view<int,_18446744073709551615UL>::cend(&span);
  v = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator!=
                ((basic_iterator<const_int> *)&expect,&local_78);
  boost::detail::test_impl
            ("span.cbegin() != span.cend()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x28c,"void iterator_suite::test_const_iterator()",v);
  local_78.parent._0_4_ = 0xb;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_78;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l,&local_a1);
  first_begin = vista::circular_view<int,_18446744073709551615UL>::cbegin(&span);
  local_a0 = vista::circular_view<int,_18446744073709551615UL>::cend(&span);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int_const>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x290,"void iterator_suite::test_const_iterator()",first_begin,local_a0,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void test_const_iterator()
{
    std::array<int, 4> array = {};
    circular_view<int> span(array.begin(), array.end());
    span.push_back(11);
    BOOST_TEST(span.cbegin() != span.cend());
    {
        std::vector<int> expect = { 11 };
        BOOST_TEST_ALL_EQ(span.cbegin(), span.cend(),
                          expect.begin(), expect.end());
    }
}